

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

__string_type * __thiscall
qclab::qasm1_abi_cxx11_(__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit)

{
  ostream *poVar1;
  stringstream stream;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,(char *)this);
  poVar1 = std::operator<<(poVar1," q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)type);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit << "];\n" ;
    return stream.str() ;
  }